

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void set_insert_node_hash(lyxp_set *set,lyd_node *node,lyxp_node_type type)

{
  uint32_t uVar1;
  int iVar2;
  hash_table *phVar3;
  long lVar4;
  ulong uVar5;
  lyd_node *local_40;
  lyxp_set_hash_node hnode;
  
  if (set->ht == (hash_table *)0x0) {
    if (3 < set->used) {
      phVar3 = lyht_new(1,0xc,set_values_equal_cb,(void *)0x0,1);
      set->ht = phVar3;
      if (set->used != 0) {
        lVar4 = 8;
        uVar5 = 0;
        do {
          local_40 = *(lyd_node **)((long)(set->val).nodes + lVar4 + -8);
          hnode.node._0_4_ = *(undefined4 *)((long)&((set->val).nodes)->node + lVar4);
          uVar1 = dict_hash_multi(0,(char *)&local_40,8);
          uVar1 = dict_hash_multi(uVar1,(char *)&hnode,4);
          uVar1 = dict_hash_multi(uVar1,(char *)0x0,0);
          iVar2 = lyht_insert(set->ht,&local_40,uVar1,(void **)0x0);
          if (iVar2 != 0) {
            __assert_fail("!r",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x275,
                          "void set_insert_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
                         );
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (uVar5 < set->used);
      }
    }
  }
  else {
    if (node == (lyd_node *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x279,
                    "void set_insert_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
                   );
    }
    local_40 = node;
    hnode.node._0_4_ = type;
    uVar1 = dict_hash_multi(0,(char *)&local_40,8);
    uVar1 = dict_hash_multi(uVar1,(char *)&hnode,4);
    uVar1 = dict_hash_multi(uVar1,(char *)0x0,0);
    iVar2 = lyht_insert(set->ht,&local_40,uVar1,(void **)0x0);
    if (iVar2 != 0) {
      __assert_fail("!r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x284,
                    "void set_insert_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
                   );
    }
  }
  return;
}

Assistant:

static void
set_insert_node_hash(struct lyxp_set *set, struct lyd_node *node, enum lyxp_node_type type)
{
    int r;
    uint32_t i, hash;
    struct lyxp_set_hash_node hnode;

    if (!set->ht && (set->used >= LY_CACHE_HT_MIN_CHILDREN)) {
        /* create hash table and add all the nodes */
        set->ht = lyht_new(1, sizeof(struct lyxp_set_hash_node), set_values_equal_cb, NULL, 1);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = dict_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = dict_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = dict_hash_multi(hash, NULL, 0);

            r = lyht_insert(set->ht, &hnode, hash, NULL);
            assert(!r);
            (void)r;
        }
    } else if (set->ht) {
        assert(node);

        /* add the new node into hash table */
        hnode.node = node;
        hnode.type = type;

        hash = dict_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
        hash = dict_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
        hash = dict_hash_multi(hash, NULL, 0);

        r = lyht_insert(set->ht, &hnode, hash, NULL);
        assert(!r);
        (void)r;
    }
}